

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *in2)

{
  bool bVar1;
  Matrix<float,_3,_3> *mat1;
  bool bVar2;
  Matrix<float,_3,_3> *mat2;
  InputLess<tcu::Matrix<float,_3,_3>_> local_1c;
  InputLess<tcu::Matrix<float,_3,_3>_> local_1b;
  InputLess<tcu::Matrix<float,_3,_3>_> local_1a;
  InputLess<tcu::Matrix<float,_3,_3>_> local_19;
  
  bVar1 = InputLess<tcu::Matrix<float,_3,_3>_>::operator()
                    (&local_1c,(Matrix<float,_3,_3> *)in1,(Matrix<float,_3,_3> *)in2);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = InputLess<tcu::Matrix<float,_3,_3>_>::operator()
                      (&local_1b,(Matrix<float,_3,_3> *)in2,(Matrix<float,_3,_3> *)in1);
    if (!bVar1) {
      mat1 = &(in1->
              super_Tuple4<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
              ).b;
      mat2 = &(in2->
              super_Tuple4<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
              ).b;
      bVar1 = InputLess<tcu::Matrix<float,_3,_3>_>::operator()(&local_1a,mat1,mat2);
      if (bVar1) {
        return true;
      }
      InputLess<tcu::Matrix<float,_3,_3>_>::operator()(&local_19,mat2,mat1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}